

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManSimCollect_rec(Gia_Man_t *pGia,Gia_Obj_t *pObj,Vec_Int_t *vVec)

{
  int Entry;
  uint uVar1;
  
  while( true ) {
    Entry = Gia_ObjToLit(pGia,pObj);
    Vec_IntPush(vVec,Entry);
    if ((((ulong)pObj & 1) != 0) || (uVar1 = (uint)*(undefined8 *)pObj, (~uVar1 & 0x9fffffff) == 0))
    {
      return;
    }
    if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) break;
    Gia_ManSimCollect_rec
              (pGia,(Gia_Obj_t *)
                    ((ulong)(uVar1 >> 0x1d & 1) | (ulong)(pObj + -(ulong)(uVar1 & 0x1fffffff))),vVec
              );
    uVar1 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    pObj = (Gia_Obj_t *)((ulong)(uVar1 >> 0x1d & 1) | (ulong)(pObj + -(ulong)(uVar1 & 0x1fffffff)));
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                ,0x3c,"void Gia_ManSimCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManSimCollect_rec( Gia_Man_t * pGia, Gia_Obj_t * pObj, Vec_Int_t * vVec )
{
    Vec_IntPush( vVec, Gia_ObjToLit(pGia, pObj) );
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManSimCollect_rec( pGia, Gia_ObjChild0(pObj), vVec );
    Gia_ManSimCollect_rec( pGia, Gia_ObjChild1(pObj), vVec );
}